

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall
ThreadParser::SAX2Handler::startElement
          (SAX2Handler *this,XMLCh *param_1,XMLCh *localname,XMLCh *param_3,Attributes *attributes)

{
  XMLCh *pXVar1;
  XMLCh *pXVar2;
  XMLCh *attVal;
  XMLCh *attNam;
  XMLSize_t i;
  XMLSize_t n;
  Attributes *attributes_local;
  XMLCh *param_3_local;
  XMLCh *localname_local;
  XMLCh *param_1_local;
  SAX2Handler *this_local;
  
  addToCheckSum(this->SAX2Instance,localname,0xffffffffffffffff);
  pXVar1 = (XMLCh *)(**(code **)(*(long *)attributes + 0x10))();
  for (attNam = (XMLCh *)0x0; attNam < pXVar1; attNam = (XMLCh *)((long)attNam + 1)) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x28))(attributes,attNam);
    addToCheckSum(this->SAX2Instance,pXVar2,0xffffffffffffffff);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x38))(attributes,attNam);
    addToCheckSum(this->SAX2Instance,pXVar2,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadParser::SAX2Handler::startElement(const XMLCh *const /*uri*/,
                              const XMLCh *const localname,
                              const XMLCh *const /*qname*/,
                              const Attributes& attributes)
{
    SAX2Instance->addToCheckSum(localname);

    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getQName(i);
        SAX2Instance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAX2Instance->addToCheckSum(attVal);
    }
}